

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O3

double __thiscall
NEST::NESTcalc::RecombOmegaNR
          (NESTcalc *this,double elecFrac,vector<double,_std::allocator<double>_> *NRERWidthsParam)

{
  double dVar1;
  pointer pdVar2;
  double dVar3;
  double dVar4;
  
  pdVar2 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pdVar2[2];
  dVar3 = exp(((elecFrac - pdVar2[3]) * (elecFrac - pdVar2[3]) * -0.5) / (pdVar2[4] * pdVar2[4]));
  dVar4 = 0.0;
  if (0.0 <= dVar3 * dVar1) {
    dVar4 = dVar3 * dVar1;
  }
  return dVar4;
}

Assistant:

double NESTcalc::RecombOmegaNR(double elecFrac,
                               const std::vector<double> &NRERWidthsParam) {
  double omega =
      NRERWidthsParam[2] * exp(-0.5 * pow(elecFrac - NRERWidthsParam[3], 2.) /
                               (NRERWidthsParam[4] * NRERWidthsParam[4]));
  if (omega < 0.) omega = 0;
  return omega;
}